

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeFabricVertexGetPropertiesExp
          (ze_fabric_vertex_handle_t hVertex,ze_fabric_vertex_exp_properties_t *pVertexProperties)

{
  ze_pfnFabricVertexGetPropertiesExp_t pfnGetPropertiesExp;
  ze_result_t result;
  ze_fabric_vertex_exp_properties_t *pVertexProperties_local;
  ze_fabric_vertex_handle_t hVertex_local;
  
  pfnGetPropertiesExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c768 != (code *)0x0) {
    pfnGetPropertiesExp._4_4_ = (*DAT_0011c768)(hVertex,pVertexProperties);
  }
  return pfnGetPropertiesExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFabricVertexGetPropertiesExp(
        ze_fabric_vertex_handle_t hVertex,              ///< [in] handle of the fabric vertex
        ze_fabric_vertex_exp_properties_t* pVertexProperties///< [in,out] query result for fabric vertex properties
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetPropertiesExp = context.zeDdiTable.FabricVertexExp.pfnGetPropertiesExp;
        if( nullptr != pfnGetPropertiesExp )
        {
            result = pfnGetPropertiesExp( hVertex, pVertexProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }